

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

global_object_create_result *
mjs::anon_unknown_35::make_console_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  global_object_create_result *p_00;
  long *plVar1;
  function_object *pfVar2;
  void *pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::gc_function> p;
  object_ptr console;
  gc_heap_ptr_untyped local_e8;
  gc_heap_ptr_untyped local_d8;
  undefined1 local_c8 [32];
  gc_heap_ptr_untyped local_a8;
  undefined1 local_98 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_90;
  gc_heap_ptr_untyped local_70;
  global_object_create_result *local_60;
  gc_heap *local_58;
  gc_heap_ptr_untyped local_50;
  undefined1 local_40 [16];
  
  local_58 = (global->super_gc_heap_ptr_untyped).heap_;
  gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::make_object((global_object *)&local_70);
  local_50.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_50.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
  gc_heap::attach(local_50.heap_,&local_50);
  local_40._0_8_ = 6;
  local_40._8_8_ = "assert";
  string::string((string *)(local_c8 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)local_40);
  plVar1 = (long *)gc_heap_ptr_untyped::get(&local_70);
  make_raw_function((mjs *)&local_e8,global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
  local_a8.heap_ = (gc_heap *)0x0;
  local_a8.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_c8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001dc0d0;
  *(gc_heap **)((long)pvVar3 + 0x10) = local_50.heap_;
  *(uint32_t *)((long)pvVar3 + 0x18) = local_50.pos_;
  if (local_50.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_50.heap_,(gc_heap_ptr_untyped *)((long)pvVar3 + 0x10));
  }
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)local_c8,
             (gc_heap_ptr<mjs::gc_string> *)(local_c8 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)&local_a8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
  local_d8.heap_ = local_e8.heap_;
  local_d8.pos_ = local_e8.pos_;
  if (local_e8.heap_ == (gc_heap *)0x0) {
    local_98._0_4_ = object;
    local_90.n_ = 0.0;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_e8.pos_;
  }
  else {
    gc_heap::attach(local_e8.heap_,&local_d8);
    local_98._0_4_ = object;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_d8.heap_;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_d8.pos_;
    if (local_d8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_98 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,local_c8 + 0x10,local_98,2);
  value::destroy((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001dc210;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._vptr__Sp_counted_base = (_func_int **)(this + 4);
  this[1]._M_use_count = 1;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  *(undefined4 *)&this[3]._vptr__Sp_counted_base = 0x3f800000;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_40._0_8_ = 3;
  local_40._8_8_ = "log";
  string::string((string *)(local_c8 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)local_40);
  plVar1 = (long *)gc_heap_ptr_untyped::get(&local_70);
  make_raw_function((mjs *)&local_e8,global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
  local_a8.heap_ = (gc_heap *)0x0;
  local_a8.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_c8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001dc110;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)local_c8,
             (gc_heap_ptr<mjs::gc_string> *)(local_c8 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)&local_a8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
  local_d8.heap_ = local_e8.heap_;
  local_d8.pos_ = local_e8.pos_;
  if (local_e8.heap_ == (gc_heap *)0x0) {
    local_98._0_4_ = object;
    local_90.n_ = 0.0;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_e8.pos_;
  }
  else {
    gc_heap::attach(local_e8.heap_,&local_d8);
    local_98._0_4_ = object;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_d8.heap_;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_d8.pos_;
    if (local_d8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_98 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,local_c8 + 0x10,local_98,2);
  local_60 = __return_storage_ptr__;
  value::destroy((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c8 + 0x10));
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_40._0_8_ = 4;
  local_40._8_8_ = "time";
  string::string((string *)(local_c8 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)local_40);
  plVar1 = (long *)gc_heap_ptr_untyped::get(&local_70);
  make_raw_function((mjs *)&local_e8,global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
  local_a8.heap_ = (gc_heap *)0x0;
  local_a8.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_c8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c8);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001dc150;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + 0x10) = this + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + 0x18) = this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  *(gc_heap **)((long)pvVar3 + 0x20) = local_58;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)local_c8,
             (gc_heap_ptr<mjs::gc_string> *)(local_c8 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)&local_a8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
  local_d8.heap_ = local_e8.heap_;
  local_d8.pos_ = local_e8.pos_;
  if (local_e8.heap_ == (gc_heap *)0x0) {
    local_98._0_4_ = object;
    local_90.n_ = 0.0;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_e8.pos_;
  }
  else {
    gc_heap::attach(local_e8.heap_,&local_d8);
    local_98._0_4_ = object;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_d8.heap_;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_d8.pos_;
    if (local_d8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_98 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,local_c8 + 0x10,local_98,2);
  value::destroy((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c8 + 0x10));
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_40._0_8_ = 7;
  local_40._8_8_ = "timeEnd";
  string::string((string *)(local_c8 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,
                 (string_view *)local_40);
  plVar1 = (long *)gc_heap_ptr_untyped::get(&local_70);
  make_raw_function((mjs *)&local_e8,global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&local_e8);
  local_a8.heap_ = (gc_heap *)0x0;
  local_a8.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_c8,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c8);
  p_00 = local_60;
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001dc190;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + 0x10) = this + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar3 + 0x18) = this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  *(gc_heap **)((long)pvVar3 + 0x20) = local_58;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)local_c8,
             (gc_heap_ptr<mjs::gc_string> *)(local_c8 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)&local_a8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
  local_d8.heap_ = local_e8.heap_;
  local_d8.pos_ = local_e8.pos_;
  if (local_e8.heap_ == (gc_heap *)0x0) {
    local_98._0_4_ = object;
    local_90.n_ = 0.0;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_e8.pos_;
  }
  else {
    gc_heap::attach(local_e8.heap_,&local_d8);
    local_98._0_4_ = object;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_d8.heap_;
    local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_d8.pos_;
    if (local_d8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)(local_98 + 8));
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1,local_c8 + 0x10,local_98,2);
  value::destroy((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c8 + 0x10));
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  (p_00->obj).super_gc_heap_ptr_untyped.heap_ = local_70.heap_;
  (p_00->obj).super_gc_heap_ptr_untyped.pos_ = local_70.pos_;
  if (local_70.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)p_00);
  }
  (p_00->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  (p_00->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
  return p_00;
}

Assistant:

global_object_create_result make_console_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto console = global->make_object();

    put_native_function(global, console, "assert", [global](const value&, const std::vector<value>& args) {
        const auto val = !args.empty() ? args.front() : value::undefined;
        if (to_boolean(val)) {
            return value::undefined;
        }
        std::wostringstream woss;
        if (args.size() > 1) {
            auto&h = global.heap();
            for (size_t i = 1; i < args.size(); ++i) {
                if (i > 1) woss << " ";
                woss << to_string(h, args[i]).view();
            }
        } else {
            debug_print(woss, val, 4);
            woss << " == true";
        }
        throw native_error_exception{native_error_type::assertion, global->stack_trace(), woss.str()};
    }, 1);

    using timer_clock = std::chrono::steady_clock;

    auto timers = std::make_shared<std::unordered_map<std::wstring, timer_clock::time_point>>();
    put_native_function(global, console, "log", [](const value&, const std::vector<value>& args) {
        for (const auto& a: args) {
            if (a.type() == value_type::string) {
                std::wcout << a.string_value();
            } else {
                mjs::debug_print(std::wcout, a, 4);
            }
            std::wcout << ' ';
        }
        std::wcout << '\n';
        return value::undefined;
    }, 1);
    put_native_function(global, console, "time", [timers, &h](const value&, const std::vector<value>& args) {
        if (args.empty()) {
            THROW_RUNTIME_ERROR("Missing argument to console.time()");
        }
        auto label = to_string(h, args.front());
        (*timers)[std::wstring{label.view()}] = timer_clock::now();
        return value::undefined;
    }, 1);
    put_native_function(global, console, "timeEnd", [timers, &h](const value&, const std::vector<value>& args) {
        const auto end_time = timer_clock::now();
        if (args.empty()) {
            THROW_RUNTIME_ERROR("Missing argument to console.timeEnd()");
        }
        auto label = to_string(h, args.front());
        auto it = timers->find(std::wstring{label.view()});
        if (it == timers->end()) {
            std::wostringstream woss;
            woss << "Timer not found: " << label;
            THROW_RUNTIME_ERROR(woss.str());
        }
        std::wcout << label << ": " << show_duration(end_time - it->second) << "\n";
        timers->erase(it);
        return value::undefined;
    }, 1);

    return { console, nullptr };
}